

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

cmTargetInternalPointer * __thiscall
cmTargetInternalPointer::operator=(cmTargetInternalPointer *this,cmTargetInternalPointer *r)

{
  cmTargetInternals *this_00;
  cmTargetInternals *this_01;
  
  if (this != r) {
    this_00 = this->Pointer;
    this_01 = (cmTargetInternals *)operator_new(0x120);
    cmTargetInternals::cmTargetInternals(this_01,r->Pointer);
    this->Pointer = this_01;
    if (this_00 != (cmTargetInternals *)0x0) {
      cmTargetInternals::~cmTargetInternals(this_00);
    }
    operator_delete(this_00,0x120);
  }
  return this;
}

Assistant:

cmTargetInternalPointer& cmTargetInternalPointer::operator=(
  cmTargetInternalPointer const& r)
{
  if (this == &r) {
    return *this;
  } // avoid warning on HP about self check
  // Ideally cmTarget instances should never be copied.  However until
  // we can make a sweep to remove that, this copy constructor avoids
  // allowing the resources (Internals) to be copied.
  cmTargetInternals* oldPointer = this->Pointer;
  this->Pointer = new cmTargetInternals(*r.Pointer);
  delete oldPointer;
  return *this;
}